

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O2

int idaLsPSolve(void *ida_mem,N_Vector r,N_Vector z,sunrealtype tol,int lr)

{
  int iVar1;
  IDALsMem idals_mem;
  IDAMem IDA_mem;
  IDALsMem local_28;
  IDAMem local_20;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"idaLsPSolve",&local_20,&local_28);
  if (iVar1 == 0) {
    iVar1 = (*local_28->psolve)(local_20->ida_tn,local_28->ycur,local_28->ypcur,local_28->rcur,r,z,
                                local_20->ida_cj,tol,local_28->pdata);
    local_28->nps = local_28->nps + 1;
  }
  return iVar1;
}

Assistant:

int idaLsPSolve(void* ida_mem, N_Vector r, N_Vector z, sunrealtype tol,
                SUNDIALS_MAYBE_UNUSED int lr)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = idals_mem->psolve(IDA_mem->ida_tn, idals_mem->ycur, idals_mem->ypcur,
                             idals_mem->rcur, r, z, IDA_mem->ida_cj, tol,
                             idals_mem->pdata);
  idals_mem->nps++;
  return (retval);
}